

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.h
# Opt level: O3

void __thiscall
mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::compress
          (updates<const_mpt::convertable_*,_mpt::graphic::hint> *this,int mask)

{
  long *plVar1;
  long *plVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  updates<const_mpt::convertable_*,_mpt::graphic::hint> uVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  
  uVar7 = *this;
  if (uVar7 == (updates<const_mpt::convertable_*,_mpt::graphic::hint>)0x0) {
    return;
  }
  if ((*(long *)((long)uVar7 + 8) == 0) && (0xf < *(ulong *)((long)uVar7 + 0x18))) {
    uVar8 = *(ulong *)((long)uVar7 + 0x18) >> 4;
    plVar6 = (long *)0x0;
    uVar4 = 0;
    do {
      lVar9 = uVar4 * 0x10;
      plVar1 = (long *)((long)uVar7 + 0x20 + lVar9);
      if (*(int *)((long)uVar7 + 0x2c + lVar9) == 0) {
        if (plVar6 == (long *)0x0) {
          plVar6 = plVar1;
        }
      }
      else {
        uVar5 = uVar4 + 1;
        if (uVar5 < uVar8) {
          piVar10 = (int *)(lVar9 + (long)uVar7 + 0x3c);
          do {
            if (((*piVar10 != 0) && (*plVar1 == *(long *)(piVar10 + -3))) &&
               (cVar3 = mpt::graphic::hint::merge((hint *)(plVar1 + 1),(int)piVar10 + -4),
               cVar3 != '\0')) {
              *(int *)((long)plVar1 + 0xcU) = *(int *)((long)plVar1 + 0xcU) + *piVar10;
              *piVar10 = 0;
            }
            uVar5 = uVar5 + 1;
            piVar10 = piVar10 + 4;
          } while (uVar5 < uVar8);
        }
        if (plVar6 == (long *)0x0) {
          plVar6 = (long *)0x0;
        }
        else {
          lVar9 = plVar1[1];
          *plVar6 = *plVar1;
          plVar6[1] = lVar9;
          *(undefined4 *)((long)plVar1 + 0xc) = 0;
          plVar2 = plVar6;
          do {
            plVar6 = plVar2 + 2;
            if (plVar1 <= plVar6) break;
            piVar10 = (int *)((long)plVar2 + 0x1c);
            plVar2 = plVar6;
          } while (*piVar10 != 0);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar8);
    uVar7 = *this;
    if (uVar7 == (updates<const_mpt::convertable_*,_mpt::graphic::hint>)0x0) {
      return;
    }
  }
  mpt::array::content::set_length((ulong)uVar7);
  return;
}

Assistant:

void compress(int mask = 0) {
		element *u = 0, *c = static_cast<element *>(base());
		long len = 0;
		
		for (long i = 0, max = length(); i < max; ++i) {
			if (!c[i].used) {
				if (!u) u = c + i;
				continue;
			}
			for (long j = i + 1; j < max; ++j) {
				if (!c[j].used || c[i].data != c[j].data) {
					continue;
				}
				if (!c[i].hint.merge(c[j].hint, mask)) {
					continue;
				}
				c[i].used += c[j].used;
				c[j].invalidate();
			}
			++len;
			
			if (!u) {
				continue;
			}
			*u = c[i];
			c[i].invalidate();
			
			while (++u < c + i) {
				if (!u->used) {
					break;
				}
			}
		}
		content *d;
		if ((d = _buf.instance())) {
			d->set_length(len * sizeof(*c));
		}
	}